

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

int Bac_ManFindRealIndex(Bac_Ntk_t *p,int iObj)

{
  int iVar1;
  Bac_NameType_t BVar2;
  int local_24;
  int local_20;
  int NameId;
  int iBit;
  int iObj_local;
  Bac_Ntk_t *p_local;
  
  local_20 = 0;
  local_24 = Bac_ObjName(p,iObj);
  iVar1 = Bac_ObjIsCi(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Bac_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xff,"int Bac_ManFindRealIndex(Bac_Ntk_t *, int)");
  }
  BVar2 = Bac_NameType(local_24);
  if (BVar2 != BAC_NAME_BIN) {
    BVar2 = Bac_NameType(local_24);
    if (BVar2 == BAC_NAME_INDEX) {
      local_20 = Abc_Lit2Var2(local_24);
      local_24 = Bac_ObjName(p,iObj - local_20);
    }
    BVar2 = Bac_NameType(local_24);
    if (BVar2 == BAC_NAME_INFO) {
      iVar1 = Abc_Lit2Var2(local_24);
      p_local._4_4_ = Bac_NtkInfoIndex(p,iVar1,local_20);
    }
    else {
      BVar2 = Bac_NameType(local_24);
      if (BVar2 != BAC_NAME_WORD) {
        __assert_fail("Bac_NameType(NameId) == BAC_NAME_WORD",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                      ,0x105,"int Bac_ManFindRealIndex(Bac_Ntk_t *, int)");
      }
      p_local._4_4_ = local_20;
    }
    return p_local._4_4_;
  }
  __assert_fail("Bac_NameType(NameId) != BAC_NAME_BIN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                ,0x100,"int Bac_ManFindRealIndex(Bac_Ntk_t *, int)");
}

Assistant:

static inline int Bac_ManFindRealIndex( Bac_Ntk_t * p, int iObj )
{
    int iBit = 0, NameId = Bac_ObjName(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
    assert( Bac_NameType(NameId) != BAC_NAME_BIN );
    if ( Bac_NameType(NameId) == BAC_NAME_INDEX )
        NameId = Bac_ObjName(p, iObj - (iBit = Abc_Lit2Var2(NameId)));
    if ( Bac_NameType(NameId) == BAC_NAME_INFO )
        return Bac_NtkInfoIndex(p, Abc_Lit2Var2(NameId), iBit);
    assert( Bac_NameType(NameId) == BAC_NAME_WORD );
    return iBit;
}